

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::cleanup::ChunkList::Cleanup(ChunkList *this,SerialArena *arena)

{
  CleanupNode *pCVar1;
  Chunk *pCVar2;
  uint uVar3;
  ulong uVar4;
  Chunk *pCVar5;
  CleanupNode *pCVar6;
  code *pcVar7;
  CleanupNode *pCVar8;
  bool bVar9;
  
  if (this->head_ == (Chunk *)0x0) {
    return;
  }
  uVar4 = (arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar4 == 0) {
    pcVar7 = (code *)0x0;
  }
  else {
    pcVar7 = *(code **)(uVar4 + 0x18);
  }
  pCVar8 = this->next_ + -1;
  pCVar5 = this->head_;
  do {
    pCVar1 = (CleanupNode *)(pCVar5 + 1);
    pCVar6 = pCVar8;
    if (pCVar1 <= pCVar8) {
      uVar3 = 0;
      do {
        pCVar6 = pCVar6 + -1;
        if (pCVar6 < pCVar1) break;
        bVar9 = uVar3 < 7;
        uVar3 = uVar3 + 1;
      } while (bVar9);
    }
    for (; pCVar1 <= pCVar6; pCVar6 = pCVar6 + -1) {
      (*pCVar8->destructor)((Chunk *)pCVar8->elem);
      pCVar8 = pCVar8 + -1;
    }
    for (; pCVar1 <= pCVar8; pCVar8 = pCVar8 + -1) {
      (*pCVar8->destructor)((Chunk *)pCVar8->elem);
    }
    pCVar2 = pCVar5->next;
    if (pcVar7 == (code *)0x0) {
      operator_delete(pCVar5,pCVar5->size);
    }
    else {
      (*pcVar7)();
    }
    if (pCVar2 == (Chunk *)0x0) {
      return;
    }
    pCVar8 = (CleanupNode *)((long)&pCVar2->next + (pCVar2->size - 0x10 & 0xfffffffffffffff0));
    pCVar5 = pCVar2;
  } while( true );
}

Assistant:

void ChunkList::Cleanup(const SerialArena& arena) {
  Chunk* c = head_;
  if (c == nullptr) return;
  GetDeallocator deallocator(arena.parent_.AllocPolicy());

  // Iterate backwards in order to destroy in the right order.
  CleanupNode* it = next_ - 1;
  while (true) {
    CleanupNode* first = c->First();
    // A prefetch distance of 8 here was chosen arbitrarily.
    constexpr int kPrefetchDistance = 8;
    CleanupNode* prefetch = it;
    // Prefetch the first kPrefetchDistance nodes.
    for (int i = 0; prefetch >= first && i < kPrefetchDistance;
         --prefetch, ++i) {
      prefetch->Prefetch();
    }
    // For the middle nodes, run destructor and prefetch the node
    // kPrefetchDistance after the current one.
    for (; prefetch >= first; --it, --prefetch) {
      it->Destroy();
      prefetch->Prefetch();
    }
    // Note: we could consider prefetching `next` chunk earlier.
    absl::PrefetchToLocalCacheNta(c->next);
    // Destroy the rest without prefetching.
    for (; it >= first; --it) {
      it->Destroy();
    }
    Chunk* next = c->next;
    deallocator({c, c->size});
    if (next == nullptr) return;
    c = next;
    it = c->Last();
  };
}